

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

_Bool smtp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *resp)

{
  smtpstate sVar1;
  int iVar2;
  ulong uVar3;
  curl_off_t max;
  char tmpline [6];
  curl_off_t code;
  char *p;
  char local_36 [3];
  undefined1 auStack_33 [3];
  int local_30 [2];
  char *local_28;
  
  if ((((len < 4) || (9 < (byte)(*line - 0x30U))) || (9 < (byte)(line[1] - 0x30U))) ||
     (9 < (byte)(line[2] - 0x30U))) {
    return false;
  }
  if (len == 5 || line[3] == ' ') {
    local_28 = local_36;
    uVar3 = (ulong)(len == 5);
    max = 999;
    if (len == 5) {
      max = 99999;
    }
    memcpy(local_28,line,uVar3 * 2 + 3);
    auStack_33[uVar3 * 2] = 0;
    iVar2 = Curl_str_number(&local_28,(curl_off_t *)local_30,max);
    if (iVar2 != 0) {
      return false;
    }
    iVar2 = 0;
    if (local_30[0] != 1) {
      iVar2 = local_30[0];
    }
    *resp = iVar2;
  }
  else {
    if (line[3] != '-') {
      return false;
    }
    sVar1 = (conn->proto).smtpc.state;
    if ((sVar1 != SMTP_COMMAND) && (sVar1 != SMTP_EHLO)) {
      return false;
    }
    *resp = 1;
  }
  return true;
}

Assistant:

static bool smtp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                           const char *line, size_t len, int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;
  (void)data;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some email servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];
    curl_off_t code;
    const char *p = tmpline;
    result = TRUE;
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    tmpline[len == 5 ? 5 : 3 ] = 0;
    if(Curl_str_number(&p, &code, len == 5 ? 99999 : 999))
      return FALSE;
    *resp = (int) code;

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}